

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O0

QString * __thiscall
QOpenGLProgramBinaryCache::cacheFileName(QOpenGLProgramBinaryCache *this,QByteArray *cacheKey)

{
  long lVar1;
  QString *a;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_QString> *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  a = (QString *)(in_RSI + 0x30);
  QString::fromUtf8<void>((QByteArray *)in_RDI);
  ::operator+(a,in_RDI);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff78);
  QStringBuilder<const_QString_&,_QString>::~QStringBuilder
            ((QStringBuilder<const_QString_&,_QString> *)0x91028c);
  QString::~QString((QString *)0x910296);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QOpenGLProgramBinaryCache::cacheFileName(const QByteArray &cacheKey) const
{
    return m_currentCacheDir + QString::fromUtf8(cacheKey);
}